

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int uv__udp_maybe_deferred_bind(uv_udp_t *handle,int domain,uint flags)

{
  sockaddr_in6 *addr_1;
  sockaddr_in *addr;
  socklen_t addrlen;
  anon_union_28_3_c0956edd taddr;
  uint flags_local;
  int domain_local;
  uv_udp_t *handle_local;
  
  if ((handle->io_watcher).fd == -1) {
    taddr._20_4_ = flags;
    taddr.in6.sin6_scope_id = domain;
    _flags_local = handle;
    if (domain == 2) {
      memset((void *)((long)&addr + 4),0,0x10);
      addr._4_2_ = 2;
      addrlen = 0;
      addr._0_4_ = 0x10;
    }
    else {
      if (domain != 10) {
        __assert_fail("0 && \"unsupported address family\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/udp.c"
                      ,0x178,"int uv__udp_maybe_deferred_bind(uv_udp_t *, int, unsigned int)");
      }
      memset((void *)((long)&addr + 4),0,0x1c);
      addr._4_2_ = 10;
      taddr._0_8_ = _in6addr_any;
      taddr._8_1_ = __dynamic_cast;
      taddr._9_1_ = __dynamic_cast_1;
      taddr._10_1_ = uRam0000000000db832a;
      taddr._11_1_ = uRam0000000000db832b;
      taddr._12_1_ = uRam0000000000db832c;
      taddr._13_1_ = uRam0000000000db832d;
      taddr._14_1_ = uRam0000000000db832e;
      taddr._15_1_ = uRam0000000000db832f;
      addr._0_4_ = 0x1c;
    }
    handle_local._4_4_ =
         uv__udp_bind(_flags_local,(sockaddr *)((long)&addr + 4),(uint)addr,taddr._20_4_);
  }
  else {
    handle_local._4_4_ = 0;
  }
  return handle_local._4_4_;
}

Assistant:

static int uv__udp_maybe_deferred_bind(uv_udp_t* handle,
                                       int domain,
                                       unsigned int flags) {
  union {
    struct sockaddr_in6 in6;
    struct sockaddr_in in;
    struct sockaddr addr;
  } taddr;
  socklen_t addrlen;

  if (handle->io_watcher.fd != -1)
    return 0;

  switch (domain) {
  case AF_INET:
  {
    struct sockaddr_in* addr = &taddr.in;
    memset(addr, 0, sizeof *addr);
    addr->sin_family = AF_INET;
    addr->sin_addr.s_addr = INADDR_ANY;
    addrlen = sizeof *addr;
    break;
  }
  case AF_INET6:
  {
    struct sockaddr_in6* addr = &taddr.in6;
    memset(addr, 0, sizeof *addr);
    addr->sin6_family = AF_INET6;
    addr->sin6_addr = in6addr_any;
    addrlen = sizeof *addr;
    break;
  }
  default:
    assert(0 && "unsupported address family");
    abort();
  }

  return uv__udp_bind(handle, &taddr.addr, addrlen, flags);
}